

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_hdr_id2int(bcf_hdr_t *h,int which,char *id)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  long lVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  char *pcVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  
  puVar3 = (uint *)h->dict[which];
  uVar1 = *puVar3;
  if (uVar1 == 0) {
    uVar6 = 0;
  }
  else {
    uVar11 = (uint)*id;
    if (*id == '\0') {
      uVar11 = 0;
    }
    else {
      cVar5 = id[1];
      if (cVar5 != '\0') {
        pcVar9 = id + 2;
        do {
          uVar11 = (int)cVar5 + uVar11 * 0x1f;
          cVar5 = *pcVar9;
          pcVar9 = pcVar9 + 1;
        } while (cVar5 != '\0');
      }
    }
    uVar11 = uVar11 & uVar1 - 1;
    lVar4 = *(long *)(puVar3 + 4);
    iVar10 = 1;
    uVar12 = uVar11;
    do {
      uVar2 = *(uint *)(lVar4 + (ulong)(uVar12 >> 4) * 4);
      bVar8 = (char)uVar12 * '\x02' & 0x1e;
      uVar6 = uVar2 >> bVar8;
      if (((uVar6 & 2) != 0) ||
         (((uVar6 & 1) == 0 &&
          (iVar7 = strcmp(*(char **)(*(long *)(puVar3 + 6) + (ulong)uVar12 * 8),id), iVar7 == 0))))
      {
        uVar6 = uVar12;
        if ((uVar2 >> bVar8 & 3) != 0) {
          uVar6 = uVar1;
        }
        break;
      }
      uVar12 = uVar12 + iVar10 & uVar1 - 1;
      iVar10 = iVar10 + 1;
      uVar6 = uVar1;
    } while (uVar12 != uVar11);
  }
  iVar10 = -1;
  if (uVar6 != uVar1) {
    iVar10 = *(int *)(*(long *)(puVar3 + 8) + 0x28 + (ulong)uVar6 * 0x30);
  }
  return iVar10;
}

Assistant:

int bcf_hdr_id2int(const bcf_hdr_t *h, int which, const char *id)
{
    khint_t k;
    vdict_t *d = (vdict_t*)h->dict[which];
    k = kh_get(vdict, d, id);
    return k == kh_end(d)? -1 : kh_val(d, k).id;
}